

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void quality_menu(char *unused,wchar_t also_unused)

{
  region area;
  menu_iter menu_f;
  menu menu;
  
  menu_f.resize = (_func_void_menu_ptr *)0x0;
  menu_f.display_row = quality_display;
  menu_f.row_handler = quality_action;
  menu_f.get_tag = (_func_char_menu_ptr_int *)0x0;
  menu_f.valid_row = quality_validity;
  area.col = 0;
  area.row = 0;
  area.width = 0;
  area.page_rows = 0;
  screen_save();
  clear_from(L'\0');
  menu_init(&menu,MN_SKIN_SCROLL,&menu_f);
  menu.title = "Quality ignore menu";
  menu_setpriv(&menu,0x1b,quality_values);
  menu_layout(&menu,&area);
  menu_select(&menu,0,false);
  screen_load();
  return;
}

Assistant:

static void quality_menu(const char *unused, int also_unused)
{
	struct menu menu;
	menu_iter menu_f = { NULL, quality_validity, quality_display,
						 quality_action, NULL };
	region area = { 0, 0, 0, 0 };

	/* Save screen */
	screen_save();
	clear_from(0);

	/* Set up the menu */
	menu_init(&menu, MN_SKIN_SCROLL, &menu_f);
	menu.title = "Quality ignore menu";
	menu_setpriv(&menu, ITYPE_MAX, quality_values);
	menu_layout(&menu, &area);

	/* Select an entry */
	menu_select(&menu, 0, false);

	/* Load screen */
	screen_load();
	return;
}